

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::init_src_block_list(CTcTokenizer *this)

{
  CTcTokSrcBlock *pCVar1;
  
  pCVar1 = (CTcTokSrcBlock *)operator_new(0xc358);
  pCVar1->nxt_ = (CTcTokSrcBlock *)0x0;
  this->src_head_ = pCVar1;
  this->src_cur_ = pCVar1;
  this->src_ptr_ = pCVar1->buf_;
  this->src_rem_ = 50000;
  return;
}

Assistant:

void CTcTokenizer::init_src_block_list()
{
    /* allocate the first source block */
    src_cur_ = src_head_ = new CTcTokSrcBlock();

    /* set up to write into the first block */
    src_ptr_ = src_head_->get_buf();
    src_rem_ = TCTOK_SRC_BLOCK_SIZE;
}